

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_movq_env_0(DisasContext *s,int d_offset)

{
  TCGContext *tcg_ctx_00;
  TCGContext *tcg_ctx;
  int d_offset_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_movi_i64_x86_64(tcg_ctx_00,s->tmp1_i64,0);
  tcg_gen_st_i64_x86_64(tcg_ctx_00,s->tmp1_i64,tcg_ctx_00->cpu_env,(long)d_offset);
  return;
}

Assistant:

static inline void gen_op_movq_env_0(DisasContext *s, int d_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_movi_i64(tcg_ctx, s->tmp1_i64, 0);
    tcg_gen_st_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, d_offset);
}